

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
fasttext::FastText::selectEmbeddings
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,FastText *this,int32_t cutoff)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  int32_t iVar4;
  pointer piVar5;
  ulong uVar6;
  int *piVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Whadup[P]weightedFastText_src_fasttext_cc:286:36)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Whadup[P]weightedFastText_src_fasttext_cc:286:36)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Whadup[P]weightedFastText_src_fasttext_cc:286:36)>
  __comp_01;
  Vector norms;
  allocator_type local_51;
  Vector local_50;
  value_type_conflict1 local_34;
  
  Vector::Vector(&local_50,
                 ((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_);
  Matrix::l2NormRow((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,&local_50);
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             ((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->m_,&local_34,&local_51);
  piVar5 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar5 != piVar3) {
    auVar8 = vpmovsxbd_avx512f(_DAT_0012de30);
    auVar9 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar10 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar11 = vpbroadcastd_avx512f(ZEXT416(0x10));
    uVar6 = 0;
    auVar12 = vpbroadcastq_avx512f();
    auVar12 = vpsrlq_avx512f(auVar12,2);
    do {
      auVar13 = vpbroadcastq_avx512f();
      auVar14 = vporq_avx512f(auVar13,auVar9);
      auVar13 = vporq_avx512f(auVar13,auVar10);
      vpcmpuq_avx512f(auVar13,auVar12,2);
      vpcmpuq_avx512f(auVar14,auVar12,2);
      auVar13 = vmovdqu32_avx512f(auVar8);
      *(undefined1 (*) [64])(piVar5 + uVar6) = auVar13;
      uVar6 = uVar6 + 0x10;
      auVar8 = vpaddd_avx512f(auVar8,auVar11);
    } while ((((ulong)((long)piVar3 + (-4 - (long)piVar5)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar6);
  }
  iVar4 = Dictionary::getId((this->dict_).
                            super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,(string *)&Dictionary::EOS_abi_cxx11_);
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    __comp._M_comp.eosid = iVar4;
    __comp._M_comp.norms = &local_50;
    __comp._M_comp._12_4_ = 0;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
              (__first,__last,
               (ulong)(uint)((int)LZCOUNT((long)__last._M_current - (long)__first._M_current >> 2) *
                            2) ^ 0x7e,__comp);
    if ((long)__last._M_current - (long)__first._M_current < 0x41) {
      __comp_01._M_comp.eosid = iVar4;
      __comp_01._M_comp.norms = &local_50;
      __comp_01._M_comp._12_4_ = 0;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
                (__first,__last,__comp_01);
    }
    else {
      __last_00._M_current = __first._M_current + 0x10;
      __comp_00._M_comp.eosid = iVar4;
      __comp_00._M_comp.norms = &local_50;
      __comp_00._M_comp._12_4_ = 0;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
                (__first,__last_00,__comp_00);
      for (; __last_00._M_current != __last._M_current;
          __last_00._M_current = __last_00._M_current + 1) {
        iVar1 = *__last_00._M_current;
        piVar7 = __last_00._M_current;
        while ((iVar2 = piVar7[-1], iVar1 == iVar4 ||
               ((iVar2 != iVar4 &&
                (local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar2] <
                 local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar1]))))) {
          *piVar7 = iVar2;
          piVar7 = piVar7 + -1;
        }
        *piVar7 = iVar1;
      }
    }
  }
  piVar5 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start + cutoff;
  if (piVar5 != (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  if (local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int32_t> FastText::selectEmbeddings(int32_t cutoff) const {
	Vector norms(input_->size(0));
	input_->l2NormRow(norms);
	std::vector<int32_t> idx(input_->size(0), 0);
	std::iota(idx.begin(), idx.end(), 0);
	auto eosid = dict_->getId(Dictionary::EOS);
	std::sort(idx.begin(), idx.end(), [&norms, eosid](size_t i1, size_t i2) {
		return eosid == i1 || (eosid != i2 && norms[i1] > norms[i2]);
	});
	idx.erase(idx.begin() + cutoff, idx.end());
	return idx;
}